

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlDOMWrapNSNormDeclareNsForced
                   (xmlDocPtr doc,xmlNodePtr elem,xmlChar *nsName,xmlChar *prefix,int checkShadow)

{
  int iVar1;
  xmlNsPtr pxVar2;
  xmlNs *local_90;
  xmlNsPtr ns2;
  xmlChar **ppxStack_80;
  int counter;
  xmlChar *pref;
  char buf [50];
  xmlNsPtr ret;
  int checkShadow_local;
  xmlChar *prefix_local;
  xmlChar *nsName_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  
  ns2._4_4_ = 0;
  if (((doc != (xmlDocPtr)0x0) && (elem != (xmlNodePtr)0x0)) &&
     (ppxStack_80 = (xmlChar **)prefix, elem->type == XML_ELEMENT_NODE)) {
    while( true ) {
      if (((elem->nsDef == (xmlNs *)0x0) ||
          (pxVar2 = xmlTreeNSListLookupByPrefix(elem->nsDef,(xmlChar *)ppxStack_80),
          pxVar2 == (xmlNsPtr)0x0)) &&
         (((checkShadow == 0 ||
           ((elem->parent == (_xmlNode *)0x0 || (elem->parent->doc == (_xmlDoc *)elem->parent)))) ||
          (iVar1 = xmlSearchNsByPrefixStrict
                             (doc,elem->parent,(xmlChar *)ppxStack_80,(xmlNsPtr *)0x0), iVar1 != 1))
         )) {
        pxVar2 = xmlNewNs((xmlNodePtr)0x0,nsName,(xmlChar *)ppxStack_80);
        if (pxVar2 == (xmlNsPtr)0x0) {
          return (xmlNsPtr)0x0;
        }
        if (elem->nsDef != (xmlNs *)0x0) {
          for (local_90 = elem->nsDef; local_90->next != (_xmlNs *)0x0; local_90 = local_90->next) {
          }
          local_90->next = pxVar2;
          return pxVar2;
        }
        elem->nsDef = pxVar2;
        return pxVar2;
      }
      ns2._4_4_ = ns2._4_4_ + 1;
      if (1000 < (int)ns2._4_4_) break;
      if (prefix == (xmlChar *)0x0) {
        snprintf((char *)&pref,0x32,"ns_%d",(ulong)ns2._4_4_);
      }
      else {
        snprintf((char *)&pref,0x32,"%.30s_%d",prefix,(ulong)ns2._4_4_);
      }
      ppxStack_80 = &pref;
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

static xmlNsPtr
xmlDOMWrapNSNormDeclareNsForced(xmlDocPtr doc,
				xmlNodePtr elem,
				const xmlChar *nsName,
				const xmlChar *prefix,
				int checkShadow)
{

    xmlNsPtr ret;
    char buf[50];
    const xmlChar *pref;
    int counter = 0;

    if ((doc == NULL) || (elem == NULL) || (elem->type != XML_ELEMENT_NODE))
        return(NULL);
    /*
    * Create a ns-decl on @anchor.
    */
    pref = prefix;
    while (1) {
	/*
	* Lookup whether the prefix is unused in elem's ns-decls.
	*/
	if ((elem->nsDef != NULL) &&
	    (xmlTreeNSListLookupByPrefix(elem->nsDef, pref) != NULL))
	    goto ns_next_prefix;
	if (checkShadow && elem->parent &&
	    ((xmlNodePtr) elem->parent->doc != elem->parent)) {
	    /*
	    * Does it shadow ancestor ns-decls?
	    */
	    if (xmlSearchNsByPrefixStrict(doc, elem->parent, pref, NULL) == 1)
		goto ns_next_prefix;
	}
	ret = xmlNewNs(NULL, nsName, pref);
	if (ret == NULL)
	    return (NULL);
	if (elem->nsDef == NULL)
	    elem->nsDef = ret;
	else {
	    xmlNsPtr ns2 = elem->nsDef;
	    while (ns2->next != NULL)
		ns2 = ns2->next;
	    ns2->next = ret;
	}
	return (ret);
ns_next_prefix:
	counter++;
	if (counter > 1000)
	    return (NULL);
	if (prefix == NULL) {
	    snprintf((char *) buf, sizeof(buf),
		"ns_%d", counter);
	} else
	    snprintf((char *) buf, sizeof(buf),
	    "%.30s_%d", (char *)prefix, counter);
	pref = BAD_CAST buf;
    }
}